

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_useek(BGZF *fp,long uoffset,int where)

{
  int iVar1;
  int iVar2;
  off_t oVar3;
  int i;
  int i_1;
  int ihi;
  int ilo;
  int where_local;
  long uoffset_local;
  BGZF *fp_local;
  
  if ((*(int *)fp << 1) >> 0x1e == 0) {
    oVar3 = hseek(fp->fp,uoffset,0);
    if (oVar3 < 0) {
      *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
      fp_local._4_4_ = -1;
    }
    else {
      fp->block_length = 0;
      fp->block_address = uoffset;
      fp->block_offset = 0;
      bgzf_read_block(fp);
      fp->uncompressed_address = uoffset;
      fp_local._4_4_ = 0;
    }
  }
  else if (fp->idx == (bgzidx_t *)0x0) {
    *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
    fp_local._4_4_ = -1;
  }
  else {
    i_1 = 0;
    i = fp->idx->noffs + -1;
    while (i_1 <= i) {
      iVar1 = (int)((double)(i_1 + i) * 0.5);
      if ((ulong)uoffset < fp->idx->offs[iVar1].uaddr) {
        i = iVar1 + -1;
      }
      else {
        if ((ulong)uoffset < fp->idx->offs[iVar1].uaddr) break;
        i_1 = iVar1 + 1;
      }
    }
    iVar1 = i_1 + -1;
    oVar3 = hseek(fp->fp,fp->idx->offs[iVar1].caddr,0);
    if (oVar3 < 0) {
      *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
      fp_local._4_4_ = -1;
    }
    else {
      fp->block_length = 0;
      fp->block_address = fp->idx->offs[iVar1].caddr;
      fp->block_offset = 0;
      iVar2 = bgzf_read_block(fp);
      if (iVar2 < 0) {
        fp_local._4_4_ = -1;
      }
      else {
        if ((uoffset != fp->idx->offs[iVar1].uaddr) &&
           (fp->block_offset = (int)uoffset - (int)fp->idx->offs[iVar1].uaddr,
           fp->block_length < fp->block_offset)) {
          __assert_fail("fp->block_offset <= fp->block_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                        ,0x45a,"int bgzf_useek(BGZF *, long, int)");
        }
        fp->uncompressed_address = uoffset;
        fp_local._4_4_ = 0;
      }
    }
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_useek(BGZF *fp, long uoffset, int where)
{
    if ( !fp->is_compressed )
    {
        if (hseek(fp->fp, uoffset, SEEK_SET) < 0)
        {
            fp->errcode |= BGZF_ERR_IO;
            return -1;
        }
        fp->block_length = 0;  // indicates current block has not been loaded
        fp->block_address = uoffset;
        fp->block_offset = 0;
        bgzf_read_block(fp);
        fp->uncompressed_address = uoffset;
        return 0;
    }

    if ( !fp->idx )
    {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }

    // binary search
    int ilo = 0, ihi = fp->idx->noffs - 1;
    while ( ilo<=ihi )
    {
        int i = (ilo+ihi)*0.5;
        if ( uoffset < fp->idx->offs[i].uaddr ) ihi = i - 1;
        else if ( uoffset >= fp->idx->offs[i].uaddr ) ilo = i + 1;
        else break;
    }
    int i = ilo-1;
    if (hseek(fp->fp, fp->idx->offs[i].caddr, SEEK_SET) < 0)
    {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    fp->block_length = 0;  // indicates current block has not been loaded
    fp->block_address = fp->idx->offs[i].caddr;
    fp->block_offset = 0;
    if ( bgzf_read_block(fp) < 0 ) return -1;
    if ( uoffset - fp->idx->offs[i].uaddr > 0 )
    {
        fp->block_offset = uoffset - fp->idx->offs[i].uaddr;
        assert( fp->block_offset <= fp->block_length );     // todo: skipped, unindexed, blocks
    }
    fp->uncompressed_address = uoffset;
    return 0;
}